

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O3

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::print
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,QDomDocument *doc,
          QDomElement *parent)

{
  undefined8 *puVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QDomNode *this_00;
  undefined8 *puVar7;
  QDomElement this_element;
  QDomText data;
  string_t local_78;
  QDomNode local_60 [8];
  string_t local_58;
  QDomNode local_40 [8];
  QDomNode local_38 [8];
  QDomNode local_30 [8];
  QDomNode local_28 [8];
  
  bVar5 = tag_t<cfgfile::qstring_trait_t>::is_defined(&this->super_tag_t<cfgfile::qstring_trait_t>);
  if (bVar5) {
    local_78.m_str.d.d = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.d;
    local_78.m_str.d.ptr = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.ptr;
    local_78.m_str.d.size = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.size;
    if (&(local_78.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_78.m_str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_78.m_str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QDomDocument::createElement((QString *)local_60);
    if (&(local_78.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_78.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    if (parent == (QDomElement *)0x0) {
      this_00 = local_28;
      QDomNode::appendChild(this_00);
    }
    else {
      this_00 = local_30;
      QDomNode::appendChild(this_00);
    }
    QDomNode::~QDomNode(this_00);
    local_78.m_str.d.d = (this->m_value).d.d;
    local_78.m_str.d.ptr = (this->m_value).d.ptr;
    local_78.m_str.d.size = (this->m_value).d.size;
    if (&(local_78.m_str.d.d)->super_QArrayData == (QArrayData *)0x0) {
      local_78.m_str.d.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_78.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    to_cfgfile_format<cfgfile::qstring_trait_t>(&local_58,&local_78);
    qVar4 = local_78.m_str.d.size;
    pcVar3 = local_78.m_str.d.ptr;
    pDVar2 = local_78.m_str.d.d;
    local_78.m_str.d.d = local_58.m_str.d.d;
    local_58.m_str.d.d = pDVar2;
    local_78.m_str.d.ptr = local_58.m_str.d.ptr;
    local_78.m_str.d.size = local_58.m_str.d.size;
    local_58.m_str.d.ptr = pcVar3;
    local_58.m_str.d.size = qVar4;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,8);
      }
    }
    local_58.m_str.d.d = local_78.m_str.d.d;
    local_58.m_str.d.ptr = local_78.m_str.d.ptr;
    local_58.m_str.d.size = local_78.m_str.d.size;
    if (&(local_78.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QDomDocument::createTextNode((QString *)local_40);
    if (&(local_58.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    QDomNode::appendChild(local_38);
    QDomNode::~QDomNode(local_38);
    iVar6 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
    if (*(long *)CONCAT44(extraout_var,iVar6) != ((long *)CONCAT44(extraout_var,iVar6))[1]) {
      iVar6 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
      puVar7 = *(undefined8 **)CONCAT44(extraout_var_00,iVar6);
      puVar1 = (undefined8 *)((long *)CONCAT44(extraout_var_00,iVar6))[1];
      if (puVar7 != puVar1) {
        do {
          (**(code **)(*(long *)*puVar7 + 0x20))((long *)*puVar7,doc,local_60);
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar1);
      }
    }
    QDomNode::~QDomNode(local_40);
    if (&(local_78.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_78.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_78.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    QDomNode::~QDomNode(local_60);
  }
  return;
}

Assistant:

void print( QDomDocument & doc, QDomElement * parent = 0 ) const override
	{
		if( this->is_defined() )
		{
			QDomElement this_element = doc.createElement( this->name() );

			if( !parent )
				doc.appendChild( this_element );
			else
				parent->appendChild( this_element );

			typename Trait::string_t value =
				format_t< typename Trait::string_t, Trait >::to_string( m_value );
			value = to_cfgfile_format< Trait >( value );

			QDomText data = doc.createTextNode( value );

			this_element.appendChild( data );

			if( !this->children().empty() )
			{
				for( const tag_t< Trait > * tag : this->children() )
					tag->print( doc, &this_element );
			}
		}
	}